

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MatrixStrideValidator::validateSingleVariable
          (MatrixStrideValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  bool bVar1;
  DataType DVar2;
  MatrixOrder MVar3;
  InterfaceBlock *pIVar4;
  VarType *pVVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  byte local_701;
  int local_6bc;
  bool local_6aa;
  allocator<char> local_6a9;
  string local_6a8;
  MessageBuilder local_688;
  MessageBuilder local_508;
  int local_388;
  allocator<char> local_381;
  int matrixStride;
  MessageBuilder local_360;
  MessageBuilder local_1d0;
  int local_4c;
  int local_48;
  int majorSize;
  int numMajorElements;
  bool columnMajor;
  bool isMatrix;
  bool isBufferBlock;
  VariablePathComponent *firstComponent;
  VariablePathComponent *component;
  string *implementationName_local;
  string *psStack_20;
  GLint propValue_local;
  string *resource_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *path_local;
  MatrixStrideValidator *this_local;
  
  component = (VariablePathComponent *)implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_20 = resource;
  resource_local = (string *)path;
  path_local = (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)this;
  firstComponent =
       std::
       vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
       ::back(path);
  _numMajorElements =
       std::
       vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
       ::front((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *)resource_local);
  bVar1 = ProgramInterfaceDefinition::VariablePathComponent::isInterfaceBlock(_numMajorElements);
  local_6aa = false;
  if (bVar1) {
    pIVar4 = ProgramInterfaceDefinition::VariablePathComponent::getInterfaceBlock(_numMajorElements)
    ;
    local_6aa = isBufferBackedInterfaceBlockStorage(pIVar4->storage);
  }
  majorSize._3_1_ = local_6aa;
  pVVar5 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(firstComponent);
  DVar2 = glu::VarType::getBasicType(pVVar5);
  majorSize._2_1_ = glu::isDataTypeMatrix(DVar2);
  if (((majorSize._3_1_ & 1) == 0) || (!(bool)majorSize._2_1_)) {
    local_701 = 0;
    if ((majorSize._3_1_ & 1) == 0) {
      pVVar5 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(firstComponent);
      DVar2 = glu::VarType::getBasicType(pVVar5);
      bVar1 = glu::isDataTypeAtomicCounter(DVar2);
      local_701 = bVar1 ^ 0xff;
    }
    local_388 = -(local_701 & 1);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_508,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_508,(char (*) [36])"Verifying matrix stride, expecting ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_388);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_508);
    if (local_388 != implementationName_local._4_4_) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_688,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_688,(char (*) [13])"\tError, got ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_688);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6a8,"resource matrix stride invalid",&local_6a9);
      PropValidator::setError((PropValidator *)this,&local_6a8);
      std::__cxx11::string::~string((string *)&local_6a8);
      std::allocator<char>::~allocator(&local_6a9);
    }
  }
  else {
    MVar3 = getMatrixOrderFromPath
                      ((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                        *)resource_local);
    majorSize._1_1_ = MVar3 != MATRIXORDER_ROW_MAJOR;
    if ((bool)majorSize._1_1_) {
      pVVar5 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(firstComponent);
      DVar2 = glu::VarType::getBasicType(pVVar5);
      local_6bc = glu::getDataTypeMatrixNumRows(DVar2);
    }
    else {
      pVVar5 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(firstComponent);
      DVar2 = glu::VarType::getBasicType(pVVar5);
      local_6bc = glu::getDataTypeMatrixNumColumns(DVar2);
    }
    local_48 = local_6bc;
    pVVar5 = ProgramInterfaceDefinition::VariablePathComponent::getVariableType(firstComponent);
    DVar2 = glu::VarType::getBasicType(pVVar5);
    DVar2 = glu::getDataTypeScalarType(DVar2);
    local_4c = getTypeSize(DVar2);
    local_4c = local_6bc * local_4c;
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
    tcu::TestLog::operator<<(&local_1d0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_1d0,
                        (char (*) [56])"Verifying matrix stride, expecting greater or equal to ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_4c);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    if (implementationName_local._4_4_ < local_4c) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx);
      tcu::TestLog::operator<<(&local_360,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_360,(char (*) [13])"\tError, got ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&implementationName_local + 4));
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_360);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&matrixStride,"resource matrix stride invalid",&local_381);
      PropValidator::setError((PropValidator *)this,(string *)&matrixStride);
      std::__cxx11::string::~string((string *)&matrixStride);
      std::allocator<char>::~allocator(&local_381);
    }
  }
  return;
}

Assistant:

void MatrixStrideValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const VariablePathComponent&	component			= path.back();
	const VariablePathComponent&	firstComponent		= path.front();

	const bool						isBufferBlock		= firstComponent.isInterfaceBlock() && isBufferBackedInterfaceBlockStorage(firstComponent.getInterfaceBlock()->storage);
	const bool						isMatrix			= glu::isDataTypeMatrix(component.getVariableType()->getBasicType());

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	// Layout tests will verify layouts of buffer backed arrays properly. Here we just check the stride is is greater or equal to the row/column size
	if (isBufferBlock && isMatrix)
	{
		const bool	columnMajor			= getMatrixOrderFromPath(path) != glu::MATRIXORDER_ROW_MAJOR;
		const int	numMajorElements	= (columnMajor) ? (glu::getDataTypeMatrixNumRows(component.getVariableType()->getBasicType())) : (glu::getDataTypeMatrixNumColumns(component.getVariableType()->getBasicType()));
		const int	majorSize			= numMajorElements * getTypeSize(glu::getDataTypeScalarType(component.getVariableType()->getBasicType()));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying matrix stride, expecting greater or equal to " << majorSize << tcu::TestLog::EndMessage;

		if (propValue < majorSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource matrix stride invalid");
		}
	}
	else
	{
		const int matrixStride = (!isBufferBlock && !glu::isDataTypeAtomicCounter(component.getVariableType()->getBasicType())) ? (-1) : (0);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying matrix stride, expecting " << matrixStride << tcu::TestLog::EndMessage;

		if (matrixStride != propValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource matrix stride invalid");
		}
	}
}